

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

Error llvm::
      handleErrorImpl<llvm::logAllUnhandledErrors(llvm::Error,llvm::raw_ostream&,llvm::Twine)::__0>
                (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload
                ,anon_class_8_1_3fcf62a2 *Handler)

{
  raw_ostream *prVar1;
  raw_ostream *this;
  int iVar2;
  size_t in_RCX;
  undefined8 *in_RDX;
  
  iVar2 = (*Handler->OS->_vptr_raw_ostream[6])(Handler->OS,&ErrorInfoBase::ID);
  prVar1 = Handler->OS;
  if ((char)iVar2 == '\0') {
    Handler->OS = (raw_ostream *)0x0;
    (Payload->_M_t).
    super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
         (ErrorInfoBase *)((ulong)prVar1 | 1);
  }
  else {
    Handler->OS = (raw_ostream *)0x0;
    iVar2 = (*prVar1->_vptr_raw_ostream[6])(prVar1,&ErrorInfoBase::ID);
    if ((char)iVar2 == '\0') {
      __assert_fail("appliesTo(*E) && \"Applying incorrect handler\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Error.h"
                    ,0x310,
                    "static Error llvm::ErrorHandlerTraits<void (&)(llvm::ErrorInfoBase &)>::apply(HandlerT &&, std::unique_ptr<ErrorInfoBase>) [HandlerT = void (&)(llvm::ErrorInfoBase &), HandlerT = (lambda at /workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Error.cpp:61:33)]"
                   );
    }
    (*prVar1->_vptr_raw_ostream[2])(prVar1,*in_RDX);
    this = (raw_ostream *)*in_RDX;
    if (this->OutBufEnd == this->OutBufCur) {
      raw_ostream::write(this,0x19c4c5,(void *)0x1,in_RCX);
    }
    else {
      *this->OutBufCur = '\n';
      this->OutBufCur = this->OutBufCur + 1;
    }
    (Payload->_M_t).
    super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl = (ErrorInfoBase *)0x1;
    (*prVar1->_vptr_raw_ostream[1])(prVar1);
  }
  return (Error)(ErrorInfoBase *)Payload;
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}